

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::SetWindingCount(Clipper *this,TEdge *edge)

{
  long64 lVar1;
  bool bVar2;
  TEdge *local_20;
  TEdge *e;
  TEdge *edge_local;
  Clipper *this_local;
  
  local_20 = edge->prevInAEL;
  while( true ) {
    bVar2 = false;
    if (local_20 != (TEdge *)0x0) {
      bVar2 = local_20->polyType != edge->polyType;
    }
    if (!bVar2) break;
    local_20 = local_20->prevInAEL;
  }
  if (local_20 == (TEdge *)0x0) {
    edge->windCnt = edge->windDelta;
    edge->windCnt2 = 0;
    local_20 = this->m_ActiveEdges;
  }
  else {
    bVar2 = IsEvenOddFillType(this,edge);
    if (bVar2) {
      edge->windCnt = 1;
      edge->windCnt2 = local_20->windCnt2;
      local_20 = local_20->nextInAEL;
    }
    else {
      if (local_20->windCnt * local_20->windDelta < 0) {
        lVar1 = Abs((long)local_20->windCnt);
        if (lVar1 < 2) {
          edge->windCnt = local_20->windCnt + local_20->windDelta + edge->windDelta;
        }
        else if (local_20->windDelta * edge->windDelta < 0) {
          edge->windCnt = local_20->windCnt;
        }
        else {
          edge->windCnt = local_20->windCnt + edge->windDelta;
        }
      }
      else {
        lVar1 = Abs((long)local_20->windCnt);
        if ((lVar1 < 2) || (-1 < local_20->windDelta * edge->windDelta)) {
          if (local_20->windCnt + edge->windDelta == 0) {
            edge->windCnt = local_20->windCnt;
          }
          else {
            edge->windCnt = local_20->windCnt + edge->windDelta;
          }
        }
        else {
          edge->windCnt = local_20->windCnt;
        }
      }
      edge->windCnt2 = local_20->windCnt2;
      local_20 = local_20->nextInAEL;
    }
  }
  bVar2 = IsEvenOddAltFillType(this,edge);
  if (bVar2) {
    for (; local_20 != edge; local_20 = local_20->nextInAEL) {
      edge->windCnt2 = (uint)(edge->windCnt2 == 0);
    }
  }
  else {
    for (; local_20 != edge; local_20 = local_20->nextInAEL) {
      edge->windCnt2 = local_20->windDelta + edge->windCnt2;
    }
  }
  return;
}

Assistant:

void Clipper::SetWindingCount(TEdge &edge)
{
  TEdge *e = edge.prevInAEL;
  //find the edge of the same polytype that immediately preceeds 'edge' in AEL
  while ( e  && e->polyType != edge.polyType ) e = e->prevInAEL;
  if ( !e )
  {
    edge.windCnt = edge.windDelta;
    edge.windCnt2 = 0;
    e = m_ActiveEdges; //ie get ready to calc windCnt2
  } else if ( IsEvenOddFillType(edge) )
  {
    //EvenOdd filling ...
    edge.windCnt = 1;
    edge.windCnt2 = e->windCnt2;
    e = e->nextInAEL; //ie get ready to calc windCnt2
  } else
  {
    //nonZero, Positive or Negative filling ...
    if ( e->windCnt * e->windDelta < 0 )
    {
      if (Abs(e->windCnt) > 1)
      {
        if (e->windDelta * edge.windDelta < 0) edge.windCnt = e->windCnt;
        else edge.windCnt = e->windCnt + edge.windDelta;
      } else
        edge.windCnt = e->windCnt + e->windDelta + edge.windDelta;
    } else
    {
      if ( Abs(e->windCnt) > 1 && e->windDelta * edge.windDelta < 0)
        edge.windCnt = e->windCnt;
      else if ( e->windCnt + edge.windDelta == 0 )
        edge.windCnt = e->windCnt;
      else edge.windCnt = e->windCnt + edge.windDelta;
    }
    edge.windCnt2 = e->windCnt2;
    e = e->nextInAEL; //ie get ready to calc windCnt2
  }

  //update windCnt2 ...
  if ( IsEvenOddAltFillType(edge) )
  {
    //EvenOdd filling ...
    while ( e != &edge )
    {
      edge.windCnt2 = (edge.windCnt2 == 0) ? 1 : 0;
      e = e->nextInAEL;
    }
  } else
  {
    //nonZero, Positive or Negative filling ...
    while ( e != &edge )
    {
      edge.windCnt2 += e->windDelta;
      e = e->nextInAEL;
    }
  }
}